

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_envs.cxx
# Opt level: O2

void __thiscall xray_re::xr_sound_env_object::load(xr_sound_env_object *this,xr_reader *r)

{
  uint __line;
  undefined8 in_RAX;
  size_t sVar1;
  char *__assertion;
  uint16_t version;
  
  version = (uint16_t)((ulong)in_RAX >> 0x30);
  sVar1 = xr_reader::r_chunk<unsigned_short>(r,0x1001,&version);
  if (sVar1 == 0) {
    __assertion = "0";
    __line = 0x11;
  }
  else if (version == 0x12) {
    xr_custom_object::load((xr_custom_object *)this,r);
    sVar1 = xr_reader::find_chunk(r,0x1003);
    if (sVar1 != 0) {
      xr_reader::r_sz(r,&this->m_inner);
      xr_reader::r_sz(r,&this->m_outer);
      return;
    }
    __assertion = "0";
    __line = 0x15;
  }
  else {
    __assertion = "version == SOUNDENV_VERSION";
    __line = 0x12;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_envs.cxx"
                ,__line,"virtual void xray_re::xr_sound_env_object::load(xr_reader &)");
}

Assistant:

void xr_sound_env_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SOUNDENV_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SOUNDENV_VERSION);
	xr_custom_object::load(r);
	if (!r.find_chunk(SOUNDENV_CHUNK_ENV_REFS))
		xr_not_expected();
	r.r_sz(m_inner);
	r.r_sz(m_outer);
	r.debug_find_chunk();
}